

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O0

_Bool pyramid_isWon(Board *board)

{
  Spot *pSVar1;
  Board *in_RDI;
  uchar i;
  byte local_11;
  _Bool local_1;
  
  local_11 = 0;
  while( true ) {
    if (0x1b < local_11) {
      if (((gConfig.game)->id == PYRAMIDRELAXED) || ((gConfig.game)->id == PYRAMIDRELAXEDEASY)) {
        local_1 = true;
      }
      else {
        pSVar1 = board_spotGet(in_RDI,FOUNDATION,'\0');
        local_1 = pSVar1->cardsCount == '4';
      }
      return local_1;
    }
    pSVar1 = board_spotGet(in_RDI,TABLEAU,local_11);
    if (pSVar1->cardsCount != '\0') break;
    local_11 = local_11 + 1;
  }
  return false;
}

Assistant:

bool pyramid_isWon(Board * board)
{
	unsigned char i;
	for(i=0;i<28;i++)
	{
		if(board_spotGet(board, TABLEAU, i)->cardsCount!=0)
			return false;
	}

	if(gConfig.game->id==PYRAMIDRELAXED || gConfig.game->id==PYRAMIDRELAXEDEASY)
		return true;

	return board_spotGet(board, FOUNDATION, 0)->cardsCount==52;
}